

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

HtaFile * __thiscall hta::storage::file::Metric::file_hta(Metric *this,Duration interval)

{
  map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
  *this_00;
  Mode MVar1;
  undefined1 auVar2 [12];
  Duration DVar3;
  iterator iVar4;
  uint uVar5;
  path *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  pVar6;
  Write local_b9;
  Duration local_b8;
  path local_b0;
  int64_t local_88 [3];
  int64_t local_70 [3];
  undefined1 local_58 [56];
  
  this_00 = &this->files_hta_;
  local_b8.__r = interval.__r;
  iVar4 = std::
          _Rb_tree<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>,_std::_Select1st<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&local_b8);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header)
  goto LAB_0015aede;
  MVar1 = this->open_mode_;
  if (MVar1 == read_write) {
    path_hta_abi_cxx11_(&local_b0,this,local_b8);
    DVar3.__r = local_b8.__r;
    (**(this->super_Metric)._vptr_Metric)(local_88,this);
    local_58._0_8_ = (pointer)0x2;
    local_58._8_8_ = DVar3.__r;
    local_58._16_8_ = 1;
    local_58._24_8_ = 1000000000;
    local_58._32_8_ = local_88[0];
    local_58._40_8_ = local_88[2];
    local_58._48_4_ = (int)local_88[1];
    local_58._52_4_ = local_88[1]._4_4_;
    pVar6 = std::
            map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
            ::
            try_emplace<hta::storage::file::FileOpenTag::ReadWrite,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                      ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                        *)this_00,(key_type *)&local_b8,(ReadWrite *)&local_b9,&local_b0,
                       (Header *)local_58);
    auVar2 = pVar6._0_12_;
LAB_0015aeca:
    iVar4._M_node = auVar2._0_8_;
    uVar5 = auVar2._8_4_;
    this_01 = (path *)&local_b0;
  }
  else {
    if (MVar1 == write) {
      path_hta_abi_cxx11_(&local_b0,this,local_b8);
      DVar3.__r = local_b8.__r;
      (**(this->super_Metric)._vptr_Metric)(local_70,this);
      local_58._0_8_ = (pointer)0x2;
      local_58._8_8_ = DVar3.__r;
      local_58._16_8_ = 1;
      local_58._24_8_ = 1000000000;
      local_58._32_8_ = local_70[0];
      local_58._40_8_ = local_70[2];
      local_58._48_4_ = (int)local_70[1];
      local_58._52_4_ = local_70[1]._4_4_;
      pVar6 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::
              try_emplace<hta::storage::file::FileOpenTag::Write,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)this_00,(key_type *)&local_b8,&local_b9,&local_b0,(Header *)local_58);
      auVar2 = pVar6._0_12_;
      goto LAB_0015aeca;
    }
    if (MVar1 != read) goto LAB_0015aede;
    path_hta_abi_cxx11_((path *)local_58,this,local_b8);
    pVar6 = std::
            map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
            ::try_emplace<hta::storage::file::FileOpenTag::Read,std::filesystem::__cxx11::path>
                      ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                        *)this_00,(key_type *)&local_b8,(Read *)&local_b0,(path *)local_58);
    iVar4._M_node = (_Base_ptr)pVar6.first._M_node;
    uVar5 = pVar6._8_4_;
    this_01 = (path *)local_58;
  }
  Catch::clara::std::filesystem::__cxx11::path::~path(this_01);
  if ((uVar5 & 1) == 0) {
    __assert_fail("added",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0x226,"Metric::HtaFile &hta::storage::file::Metric::file_hta(Duration)");
  }
LAB_0015aede:
  return (HtaFile *)&iVar4._M_node[1]._M_parent;
}

Assistant:

Metric::HtaFile& Metric::file_hta(Duration interval)
{
    auto it = files_hta_.find(interval);
    if (it == files_hta_.end())
    {
        bool added;
        switch (open_mode_)
        {
        case Mode::read:
            std::tie(it, added) =
                files_hta_.try_emplace(interval, FileOpenTag::Read(), path_hta(interval));
            break;
        case Mode::write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::Write(), path_hta(interval), Header(interval, meta()));
            break;
        case Mode::read_write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::ReadWrite(), path_hta(interval), Header(interval, meta()));
            break;
        }
        assert(added);
    }
    return it->second;
}